

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdfdrivr.c
# Opt level: O2

FT_Error BDF_Face_Init(FT_Stream stream,FT_Face bdfface,FT_Int face_index,FT_Int num_params,
                      FT_Parameter *params)

{
  char cVar1;
  unsigned_long cur_count;
  FT_Memory memory;
  bdf_font_t *font;
  void *__src;
  bdf_glyph_t *pbVar2;
  short sVar3;
  FT_Face pFVar4;
  short sVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  size_t mm;
  ulong *puVar9;
  undefined1 *puVar10;
  bdf_property_t *pbVar11;
  FT_String *pFVar12;
  char *pcVar13;
  size_t sVar14;
  size_t sVar15;
  FT_Bitmap_Size *pFVar16;
  ulong uVar17;
  FT_Pointer pvVar18;
  bdf_property_t *pbVar19;
  byte *pbVar20;
  FT_Face pFVar21;
  long lVar22;
  anon_union_8_3_ccdffb78_for_value *paVar23;
  undefined2 *puVar24;
  ulong uVar25;
  undefined4 uVar26;
  long lVar27;
  size_t __n;
  ushort uVar28;
  FT_Memory memory_00;
  long lVar29;
  FT_Long FVar30;
  long *plVar31;
  bdf_font_t *font_00;
  FT_Stream stream_00;
  long lVar32;
  bool bVar33;
  undefined8 uStack_f0;
  bdf_options_t options;
  size_t local_d8 [5];
  ulong local_b0;
  FT_Memory local_a8;
  FT_Memory local_a0;
  FT_Stream local_98;
  long local_90;
  undefined1 auStack_88 [8];
  _bdf_line_func_t cb;
  char *local_78;
  char *pcStack_70;
  FT_Int local_5c;
  undefined1 *local_58;
  long local_50;
  ulong *local_48;
  FT_Error local_40;
  FT_Error local_3c;
  FT_Face pFStack_38;
  FT_Error error;
  
  memory_00 = bdfface->memory;
  pFStack_38 = bdfface;
  local_40 = FT_Stream_Seek(stream,0);
  if (local_40 != 0) {
    return local_40;
  }
  uStack_f0 = 0x100000001;
  options.correct_metrics = 0;
  options.keep_unencoded = 8;
  local_3c = 0;
  puVar9 = (ulong *)ft_mem_alloc(memory_00,0x44078,&local_3c);
  if (local_3c == 0) {
    puVar9[8] = (ulong)&uStack_f0;
    *(undefined2 *)(puVar9 + 3) = 0x7fff;
    puVar9[0x880e] = stream->size;
    puVar9[0x880d] = (ulong)memory_00;
    puVar9[0x880b] = 0;
    puVar9[0x8809] = 0;
    puVar9[0x880a] = 0;
    puVar9[0x880c] = (ulong)memory_00;
    local_a8 = stream->memory;
    local_d8[0] = local_d8[0] & 0xffffffff00000000;
    local_a0 = memory_00;
    local_5c = face_index;
    local_48 = puVar9;
    puVar10 = (undefined1 *)ft_mem_realloc(local_a8,1,0,0x400,(void *)0x0,(FT_Error *)local_d8);
    if ((int)local_d8[0] == 0) {
      auStack_88 = (undefined1  [8])_bdf_parse_start;
      *puVar10 = 0;
      local_50 = CONCAT44(local_50._4_4_,0x100);
      sVar14 = 0;
      lVar27 = 0;
      local_90 = 1;
      uVar25 = 0;
      uVar17 = 0x400;
      local_98 = stream;
LAB_001f44cb:
      local_58 = puVar10;
      local_b0 = uVar17;
      bVar33 = false;
      lVar22 = 0;
      puVar10 = local_58;
      stream_00 = stream;
      do {
        uVar17 = local_b0;
        sVar15 = uVar25;
        iVar8 = (int)local_50;
        while( true ) {
          if (!bVar33) {
            sVar14 = FT_Stream_TryRead(stream_00,puVar10 + sVar15,uVar17 - sVar15);
            lVar27 = sVar14 + sVar15;
            sVar15 = 0;
            puVar10 = local_58;
          }
          stream = local_98;
          uVar25 = local_b0;
          __n = lVar27 - lVar22;
          if ((__n == 0 || lVar27 < lVar22) || (iVar8 != (char)puVar10[lVar22])) break;
          lVar22 = lVar22 + 1;
          iVar8 = 0x100;
          bVar33 = true;
        }
        local_50 = CONCAT44(local_50._4_4_,iVar8);
        lVar32 = 0;
        lVar29 = lVar22;
        while( true ) {
          if (lVar27 <= lVar29) {
            if (sVar14 == 0) goto LAB_001f431a;
            if (lVar22 != 0) {
              memmove(puVar10,puVar10 + lVar22,__n);
              sVar14 = __n;
              lVar27 = lVar22;
              uVar25 = __n;
              stream = local_98;
              uVar17 = local_b0;
              puVar10 = local_58;
              goto LAB_001f44cb;
            }
            if (0xffff < local_b0) {
              local_d8[0] = CONCAT44(local_d8[0]._4_4_,6);
              goto LAB_001f431a;
            }
            uVar17 = local_b0 * 2;
            puVar10 = (undefined1 *)
                      ft_mem_realloc(local_a8,1,local_b0,uVar17,puVar10,(FT_Error *)local_d8);
            if ((int)local_d8[0] == 0) goto LAB_001f44cb;
            goto LAB_001f431a;
          }
          cVar1 = puVar10[lVar29];
          if ((cVar1 == '\n') || (cVar1 == '\r')) break;
          lVar29 = lVar29 + 1;
          lVar32 = lVar32 + 1;
        }
        puVar10[lVar29] = 0;
        uVar25 = sVar15;
        if ((puVar10[lVar22] != '\x1a') && ((puVar10[lVar22] != '#' && (lVar22 < lVar29)))) {
          options._8_8_ = sVar15;
          local_50 = lVar27;
          iVar8 = (*(code *)auStack_88)(puVar10 + lVar22,lVar32,local_90,auStack_88,local_48);
          local_d8[0] = CONCAT44(local_d8[0]._4_4_,iVar8);
          if (iVar8 == -1) {
            iVar8 = (*(code *)auStack_88)(puVar10 + lVar22,lVar32,local_90,auStack_88,local_48);
            local_d8[0] = CONCAT44(local_d8[0]._4_4_,iVar8);
          }
          lVar27 = local_50;
          uVar25 = options._8_8_;
          puVar10 = local_58;
          if (iVar8 != 0) break;
        }
        local_90 = local_90 + 1;
        puVar10[lVar29] = cVar1;
        lVar22 = lVar29 + 1;
        uVar26 = 0x100;
        if (cVar1 == '\r') {
          uVar26 = 10;
        }
        if (cVar1 == '\n') {
          uVar26 = 0xd;
        }
        local_50 = CONCAT44(local_50._4_4_,uVar26);
        bVar33 = true;
        stream_00 = local_98;
      } while( true );
    }
LAB_001f431a:
    ft_mem_free(local_a8,puVar10);
    face_index = local_5c;
    memory_00 = local_a0;
    local_3c = (int)local_d8[0];
    font_00 = (bdf_font_t *)local_48[7];
    if ((int)local_d8[0] == 0) {
      puVar9 = local_48;
      if (font_00 == (bdf_font_t *)0x0) {
        uVar17 = *local_48;
        if ((uVar17 & 1) != 0) goto LAB_001f4a2b;
        local_3c = 3;
        goto LAB_001f436d;
      }
      if (font_00->spacing != 8) {
        font_00->monowidth = (font_00->bbx).width;
      }
      if (local_48[1] != font_00->unencoded_used + font_00->glyphs_used) {
        font_00->modified = 1;
      }
      if ((font_00->unencoded_used != 0 || font_00->glyphs_used != 0) && (*(int *)local_48[8] != 0))
      {
        sVar5 = (short)local_48[3];
        uVar6 = (int)*(short *)((long)local_48 + 0x1c) - (int)sVar5;
        if (uVar6 != (font_00->bbx).width) {
          (font_00->bbx).width = (unsigned_short)uVar6;
          font_00->modified = 1;
        }
        if ((font_00->bbx).x_offset != sVar5) {
          (font_00->bbx).x_offset = sVar5;
          font_00->modified = 1;
        }
        sVar5 = *(short *)((long)local_48 + 0x1e);
        if ((font_00->bbx).ascent != sVar5) {
          (font_00->bbx).ascent = sVar5;
          font_00->modified = 1;
        }
        sVar3 = (short)local_48[4];
        if ((font_00->bbx).descent != sVar3) {
          (font_00->bbx).descent = sVar3;
          (font_00->bbx).y_offset = -sVar3;
          font_00->modified = 1;
        }
        if ((int)sVar3 + (int)sVar5 != (uint)(font_00->bbx).height) {
          (font_00->bbx).height = (unsigned_short)((int)sVar3 + (int)sVar5);
        }
      }
      uVar17 = *local_48;
      if ((uVar17 & 1) != 0) {
LAB_001f4a2b:
        if ((uVar17 & 0x20) == 0) {
          local_3c = 0xb9;
        }
        else {
          local_3c = 0xba;
        }
        goto LAB_001f434d;
      }
      cur_count = font_00->comments_len;
      if (cur_count != 0) {
        pcVar13 = (char *)ft_mem_realloc(font_00->memory,1,cur_count,cur_count + 1,font_00->comments
                                         ,&local_3c);
        font_00 = (bdf_font_t *)local_48[7];
        font_00->comments = pcVar13;
        if (local_3c != 0) goto LAB_001f434d;
        pcVar13[font_00->comments_len] = '\0';
        font_00 = (bdf_font_t *)local_48[7];
        puVar9 = local_48;
      }
    }
    else {
LAB_001f434d:
      bdf_free_font(font_00);
      puVar9 = local_48;
      ft_mem_free(memory_00,(void *)local_48[7]);
      puVar9[7] = 0;
LAB_001f436d:
      font_00 = (bdf_font_t *)0x0;
    }
LAB_001f4370:
    _bdf_list_done((_bdf_list_t *)(puVar9 + 0x8809));
    ft_mem_free(memory_00,(void *)puVar9[5]);
    puVar9[5] = 0;
    ft_mem_free(memory_00,puVar9);
  }
  else {
    font_00 = (bdf_font_t *)0x0;
    if (puVar9 != (ulong *)0x0) goto LAB_001f4370;
  }
  local_40 = local_3c;
  if ((char)local_3c == -0x50) {
    BDF_Face_Done(pFStack_38);
    return 2;
  }
  if (local_3c != 0) {
    return local_3c;
  }
  pFStack_38[1].face_flags = (FT_Long)font_00;
  if ((short)face_index != 0 && 0 < face_index) {
    BDF_Face_Done(pFStack_38);
    return 6;
  }
  pFStack_38->num_faces = 1;
  pFStack_38->face_index = 0;
  *(byte *)&pFStack_38->face_flags = (byte)pFStack_38->face_flags | 0x92;
  pbVar11 = bdf_get_font_property(font_00,"SPACING");
  if ((((pbVar11 != (bdf_property_t *)0x0) && (pbVar11->format == 1)) &&
      ((byte *)(pbVar11->value).atom != (byte *)0x0)) &&
     ((uVar6 = (byte)*(pbVar11->value).atom - 0x43, uVar6 < 0x2b &&
      ((0x40100000401U >> ((ulong)uVar6 & 0x3f) & 1) != 0)))) {
    *(byte *)&pFStack_38->face_flags = (byte)pFStack_38->face_flags | 4;
  }
  pbVar11 = bdf_get_font_property(font_00,"FAMILY_NAME");
  if ((pbVar11 == (bdf_property_t *)0x0) || ((pbVar11->value).atom == (char *)0x0)) {
    pFStack_38->family_name = (FT_String *)0x0;
  }
  else {
    pFVar12 = (FT_String *)ft_mem_strdup(memory_00,(pbVar11->value).atom,&local_40);
    pFStack_38->family_name = pFVar12;
    if (local_40 != 0) {
      return local_40;
    }
  }
  local_3c = 0;
  memory = pFStack_38->memory;
  font = (bdf_font_t *)pFStack_38[1].face_flags;
  local_78 = (char *)0x0;
  pcStack_70 = (char *)0x0;
  auStack_88 = (undefined1  [8])0x0;
  cb = (_bdf_line_func_t)0x0;
  pFStack_38->style_flags = 0;
  pbVar11 = bdf_get_font_property(font,"SLANT");
  if ((((pbVar11 != (bdf_property_t *)0x0) && (pbVar11->format == 1)) &&
      ((byte *)(pbVar11->value).atom != (byte *)0x0)) &&
     ((uVar6 = (byte)*(pbVar11->value).atom - 0x49, uVar6 < 0x27 &&
      ((0x4100000041U >> ((ulong)uVar6 & 0x3f) & 1) != 0)))) {
    *(byte *)&pFStack_38->style_flags = (byte)pFStack_38->style_flags | 1;
    local_78 = "Italic";
    if ((*(pbVar11->value).atom & 0xdfU) == 0x4f) {
      local_78 = "Oblique";
    }
  }
  pbVar11 = bdf_get_font_property(font,"WEIGHT_NAME");
  if (((pbVar11 != (bdf_property_t *)0x0) && (pbVar11->format == 1)) &&
     (((byte *)(pbVar11->value).atom != (byte *)0x0 &&
      ((byte)(*(pbVar11->value).atom | 0x20U) == 0x62)))) {
    *(byte *)&pFStack_38->style_flags = (byte)pFStack_38->style_flags | 2;
    cb = (_bdf_line_func_t)0x250542;
  }
  pbVar11 = bdf_get_font_property(font,"SETWIDTH_NAME");
  if (((((pbVar11 != (bdf_property_t *)0x0) && (pbVar11->format == 1)) &&
       (pcVar13 = (pbVar11->value).atom, pcVar13 != (char *)0x0)) &&
      ((cVar1 = *pcVar13, cVar1 != '\0' && (cVar1 != 'N')))) && (cVar1 != 'n')) {
    pcStack_70 = pcVar13;
  }
  pbVar11 = bdf_get_font_property(font,"ADD_STYLE_NAME");
  if (((pbVar11 != (bdf_property_t *)0x0) && (pbVar11->format == 1)) &&
     ((pFVar21 = (FT_Face)(pbVar11->value).atom, pFVar21 != (FT_Face)0x0 &&
      (((cVar1 = (char)pFVar21->num_faces, cVar1 != '\0' && (cVar1 != 'N')) && (cVar1 != 'n')))))) {
    auStack_88 = (undefined1  [8])pFVar21;
  }
  FVar30 = 0;
  for (lVar27 = 0; lVar27 != 4; lVar27 = lVar27 + 1) {
    local_d8[lVar27] = 0;
    if (*(char **)(auStack_88 + lVar27 * 8) != (char *)0x0) {
      sVar14 = strlen(*(char **)(auStack_88 + lVar27 * 8));
      local_d8[lVar27] = sVar14;
      FVar30 = FVar30 + sVar14 + 1;
    }
  }
  if (FVar30 == 0) {
    auStack_88 = (undefined1  [8])0x24f955;
    local_d8[0] = 7;
    FVar30 = 8;
  }
  pFVar12 = (FT_String *)ft_mem_alloc(memory,FVar30,&local_3c);
  pFStack_38->style_name = pFVar12;
  if (local_3c != 0) {
    return local_3c;
  }
  pFVar21 = pFStack_38;
  for (lVar27 = 0; pFVar4 = pFStack_38, lVar27 != 4; lVar27 = lVar27 + 1) {
    __src = *(void **)(auStack_88 + lVar27 * 8);
    if (__src != (void *)0x0) {
      sVar14 = local_d8[lVar27];
      if (pFVar12 != pFVar21->style_name) {
        *pFVar12 = ' ';
        pFVar12 = pFVar12 + 1;
      }
      memcpy(pFVar12,__src,sVar14);
      if ((lVar27 == 3) || (lVar27 == 0)) {
        for (sVar15 = 0; sVar14 != sVar15; sVar15 = sVar15 + 1) {
          if (pFVar12[sVar15] == ' ') {
            pFVar12[sVar15] = '-';
          }
        }
      }
      pFVar12 = pFVar12 + sVar14;
      pFVar21 = pFStack_38;
    }
  }
  *pFVar12 = '\0';
  local_40 = local_3c;
  if (local_3c != 0) {
    return local_3c;
  }
  pFStack_38->num_glyphs = font_00->glyphs_size + 1;
  pFStack_38->num_fixed_sizes = 1;
  pFVar16 = (FT_Bitmap_Size *)ft_mem_realloc(memory_00,0x20,0,1,(void *)0x0,&local_40);
  pFVar4->available_sizes = pFVar16;
  if (local_40 != 0) {
    return local_40;
  }
  pFVar16->x_ppem = 0;
  pFVar16->y_ppem = 0;
  pFVar16->height = 0;
  pFVar16->width = 0;
  *(undefined4 *)&pFVar16->field_0x4 = 0;
  pFVar16->size = 0;
  lVar27 = font_00->font_ascent;
  if (lVar27 - 0x8000U < 0xffffffffffff0001) {
    bVar33 = lVar27 < 0;
    lVar27 = 0x7fff;
    if (bVar33) {
      lVar27 = -0x7fff;
    }
    font_00->font_ascent = lVar27;
  }
  lVar22 = font_00->font_descent;
  if (lVar22 - 0x8000U < 0xffffffffffff0001) {
    bVar33 = lVar22 < 0;
    lVar22 = 0x7fff;
    if (bVar33) {
      lVar22 = -0x7fff;
    }
    font_00->font_descent = lVar22;
  }
  pFVar16->height = (short)lVar22 + (short)lVar27;
  pbVar11 = bdf_get_font_property(font_00,"AVERAGE_WIDTH");
  if (pbVar11 == (bdf_property_t *)0x0) {
    FVar30 = FT_MulDiv((long)pFVar16->height,2,3);
    sVar5 = (short)FVar30;
  }
  else {
    sVar5 = 0x7fff;
    if (0xfffffffffff6001c < (pbVar11->value).l - 0x4fff2U) {
      lVar27 = (long)((int)(pbVar11->value).l + 5) / 10;
      sVar3 = (short)lVar27;
      sVar5 = -sVar3;
      if (0 < (int)lVar27) {
        sVar5 = sVar3;
      }
    }
  }
  pFVar16->width = sVar5;
  pbVar11 = bdf_get_font_property(font_00,"POINT_SIZE");
  if (pbVar11 == (bdf_property_t *)0x0) {
    uVar17 = font_00->point_size;
    if (uVar17 == 0) {
      FVar30 = (long)pFVar16->width << 6;
    }
    else {
      FVar30 = 0x7fff;
      if (uVar17 < 0x8000) {
        FVar30 = uVar17 << 6;
      }
    }
  }
  else {
    lVar27 = (pbVar11->value).l;
    FVar30 = 0x7fff;
    if (0xfffffffffff5f67a < lVar27 - 0x504c3U) {
      lVar22 = -lVar27;
      if (0 < lVar27) {
        lVar22 = lVar27;
      }
      FVar30 = FT_MulDiv(lVar22,0x70800,0x11a4e);
    }
  }
  pFVar16->size = FVar30;
  pbVar11 = bdf_get_font_property(font_00,"PIXEL_SIZE");
  if (pbVar11 != (bdf_property_t *)0x0) {
    iVar7 = (int)(pbVar11->value).l;
    iVar8 = -iVar7;
    if (0 < iVar7) {
      iVar8 = iVar7;
    }
    uVar17 = 0x1fffc0;
    if (0xffffffffffff0000 < (pbVar11->value).l - 0x8000U) {
      uVar17 = (ulong)(uint)(iVar8 << 6);
    }
    pFVar16->y_ppem = uVar17;
  }
  pbVar11 = bdf_get_font_property(font_00,"RESOLUTION_X");
  paVar23 = &pbVar11->value;
  if (pbVar11 == (bdf_property_t *)0x0) {
    paVar23 = (anon_union_8_3_ccdffb78_for_value *)&font_00->resolution_x;
  }
  lVar27 = paVar23->l;
  if (lVar27 == 0) {
    uVar28 = 0;
  }
  else {
    uVar28 = 0x7fff;
    if (0xffffffffffff0000 < lVar27 - 0x8000U) {
      uVar28 = -(ushort)lVar27;
      if (0 < (int)lVar27) {
        uVar28 = (ushort)lVar27;
      }
    }
  }
  pbVar11 = bdf_get_font_property(font_00,"RESOLUTION_Y");
  paVar23 = &pbVar11->value;
  if (pbVar11 == (bdf_property_t *)0x0) {
    paVar23 = (anon_union_8_3_ccdffb78_for_value *)&font_00->resolution_y;
  }
  uVar17 = paVar23->l;
  if (uVar17 == 0) {
    uVar25 = 0;
  }
  else {
    uVar25 = 0x7fff;
    if ((0xffffffffffff0000 < uVar17 - 0x8000) &&
       (uVar25 = (ulong)(uint)-(int)uVar17, 0 < (int)uVar17)) {
      uVar25 = uVar17 & 0xffffffff;
    }
  }
  FVar30 = pFVar16->y_ppem;
  puVar10 = (undefined1 *)(uVar25 & 0xffff);
  if (FVar30 == 0) {
    FVar30 = pFVar16->size;
    pFVar16->y_ppem = FVar30;
    if ((short)uVar25 == 0) goto LAB_001f4d00;
    local_58 = puVar10;
    FVar30 = FT_MulDiv(FVar30,(FT_Long)puVar10,0x48);
    pFVar16->y_ppem = FVar30;
    puVar10 = local_58;
  }
  if ((uVar28 != 0) && ((short)uVar25 != 0)) {
    FVar30 = FT_MulDiv(FVar30,(ulong)uVar28,(FT_Long)puVar10);
  }
LAB_001f4d00:
  pFVar16->x_ppem = FVar30;
  pbVar2 = font_00->glyphs;
  pvVar18 = ft_mem_realloc(memory_00,0x10,0,font_00->glyphs_size,(void *)0x0,&local_40);
  pFStack_38[1].style_flags = (FT_Long)pvVar18;
  if (local_40 == 0) {
    pFStack_38[1].num_fixed_sizes = 0;
    uVar17 = font_00->glyphs_size;
    puVar24 = (undefined2 *)((long)pvVar18 + 8);
    plVar31 = &pbVar2->encoding;
    for (uVar25 = 0; uVar17 != uVar25; uVar25 = uVar25 + 1) {
      lVar27 = *plVar31;
      *(long *)(puVar24 + -4) = lVar27;
      *puVar24 = (short)uVar25;
      if ((uVar25 < 0xffffffff) && (lVar27 == font_00->default_char)) {
        pFStack_38[1].num_fixed_sizes = (FT_Int)uVar25;
      }
      puVar24 = puVar24 + 8;
      plVar31 = plVar31 + 7;
    }
    pbVar11 = bdf_get_font_property(font_00,"CHARSET_REGISTRY");
    pbVar19 = bdf_get_font_property(font_00,"CHARSET_ENCODING");
    pFVar21 = pFStack_38;
    if ((((pbVar19 == (bdf_property_t *)0x0 || pbVar11 == (bdf_property_t *)0x0) ||
         (pbVar11->format != 1)) || (pbVar19->format != 1)) ||
       (((pbVar11->value).atom == (char *)0x0 || ((pbVar19->value).atom == (char *)0x0)))) {
      auStack_88 = (undefined1  [8])pFStack_38;
      cb = (_bdf_line_func_t)0x741444f42;
      local_40 = FT_CMap_New(&bdf_cmap_class,(FT_Pointer)0x0,(FT_CharMap)auStack_88,
                             (FT_CMap_conflict *)0x0);
      if (pFVar21->num_charmaps != 0) {
        pFVar21->charmap = *pFVar21->charmaps;
      }
    }
    else {
      pvVar18 = ft_mem_strdup(memory_00,(pbVar19->value).atom,&local_40);
      pFStack_38[1].num_faces = (FT_Long)pvVar18;
      if (local_40 == 0) {
        pbVar20 = (byte *)ft_mem_strdup(memory_00,(pbVar11->value).atom,&local_40);
        pFStack_38[1].face_index = (FT_Long)pbVar20;
        if (local_40 == 0) {
          bVar33 = true;
          if ((((*pbVar20 | 0x20) == 0x69) && ((pbVar20[1] | 0x20) == 0x73)) &&
             ((pbVar20[2] | 0x20) == 0x6f)) {
            pbVar20 = pbVar20 + 3;
            iVar8 = strcmp((char *)pbVar20,"10646");
            if ((iVar8 == 0) ||
               (((iVar8 = strcmp((char *)pbVar20,"8859"), iVar8 == 0 &&
                 (*(char *)pFStack_38[1].num_faces == '1')) &&
                (((char *)pFStack_38[1].num_faces)[1] == '\0')))) {
              bVar33 = false;
            }
            else {
              iVar8 = strcmp((char *)pbVar20,"646.1991");
              if (iVar8 == 0) {
                iVar8 = strcmp((char *)pFStack_38[1].num_faces,"IRV");
                bVar33 = iVar8 != 0;
              }
            }
          }
          auStack_88 = (undefined1  [8])pFStack_38;
          cb = (_bdf_line_func_t)0x0;
          if (!bVar33) {
            cb = (_bdf_line_func_t)0x10003756e6963;
          }
          local_40 = FT_CMap_New(&bdf_cmap_class,(FT_Pointer)0x0,(FT_CharMap)auStack_88,
                                 (FT_CMap_conflict *)0x0);
        }
      }
    }
  }
  return local_40;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  BDF_Face_Init( FT_Stream      stream,
                 FT_Face        bdfface,        /* BDF_Face */
                 FT_Int         face_index,
                 FT_Int         num_params,
                 FT_Parameter*  params )
  {
    FT_Error       error  = FT_Err_Ok;
    BDF_Face       face   = (BDF_Face)bdfface;
    FT_Memory      memory = FT_FACE_MEMORY( face );

    bdf_font_t*    font = NULL;
    bdf_options_t  options;

    FT_UNUSED( num_params );
    FT_UNUSED( params );


    FT_TRACE2(( "BDF driver\n" ));

    if ( FT_STREAM_SEEK( 0 ) )
      goto Exit;

    options.correct_metrics = 1;   /* FZ XXX: options semantics */
    options.keep_unencoded  = 1;
    options.keep_comments   = 0;
    options.font_spacing    = BDF_PROPORTIONAL;

    error = bdf_load_font( stream, memory, &options, &font );
    if ( FT_ERR_EQ( error, Missing_Startfont_Field ) )
    {
      FT_TRACE2(( "  not a BDF file\n" ));
      goto Fail;
    }
    else if ( error )
      goto Exit;

    /* we have a bdf font: let's construct the face object */
    face->bdffont = font;

    /* BDF cannot have multiple faces in a single font file.
     * XXX: non-zero face_index is already invalid argument, but
     *      Type1, Type42 driver has a convention to return
     *      an invalid argument error when the font could be
     *      opened by the specified driver.
     */
    if ( face_index > 0 && ( face_index & 0xFFFF ) > 0 )
    {
      FT_ERROR(( "BDF_Face_Init: invalid face index\n" ));
      BDF_Face_Done( bdfface );
      return FT_THROW( Invalid_Argument );
    }

    {
      bdf_property_t*  prop = NULL;


      FT_TRACE4(( "  number of glyphs: allocated %d (used %d)\n",
                  font->glyphs_size,
                  font->glyphs_used ));
      FT_TRACE4(( "  number of unencoded glyphs: allocated %d (used %d)\n",
                  font->unencoded_size,
                  font->unencoded_used ));

      bdfface->num_faces  = 1;
      bdfface->face_index = 0;

      bdfface->face_flags |= FT_FACE_FLAG_FIXED_SIZES |
                             FT_FACE_FLAG_HORIZONTAL  |
                             FT_FACE_FLAG_FAST_GLYPHS;

      prop = bdf_get_font_property( font, "SPACING" );
      if ( prop && prop->format == BDF_ATOM                             &&
           prop->value.atom                                             &&
           ( *(prop->value.atom) == 'M' || *(prop->value.atom) == 'm' ||
             *(prop->value.atom) == 'C' || *(prop->value.atom) == 'c' ) )
        bdfface->face_flags |= FT_FACE_FLAG_FIXED_WIDTH;

      /* FZ XXX: TO DO: FT_FACE_FLAGS_VERTICAL   */
      /* FZ XXX: I need a font to implement this */

      prop = bdf_get_font_property( font, "FAMILY_NAME" );
      if ( prop && prop->value.atom )
      {
        if ( FT_STRDUP( bdfface->family_name, prop->value.atom ) )
          goto Exit;
      }
      else
        bdfface->family_name = NULL;

      if ( FT_SET_ERROR( bdf_interpret_style( face ) ) )
        goto Exit;

      /* the number of glyphs (with one slot for the undefined glyph */
      /* at position 0 and all unencoded glyphs)                     */
      bdfface->num_glyphs = (FT_Long)( font->glyphs_size + 1 );

      bdfface->num_fixed_sizes = 1;
      if ( FT_NEW_ARRAY( bdfface->available_sizes, 1 ) )
        goto Exit;

      {
        FT_Bitmap_Size*  bsize = bdfface->available_sizes;
        FT_Short         resolution_x = 0, resolution_y = 0;
        long             value;


        FT_ZERO( bsize );

        /* sanity checks */
        if ( font->font_ascent > 0x7FFF || font->font_ascent < -0x7FFF )
        {
          font->font_ascent = font->font_ascent < 0 ? -0x7FFF : 0x7FFF;
          FT_TRACE0(( "BDF_Face_Init: clamping font ascent to value %d\n",
                      font->font_ascent ));
        }
        if ( font->font_descent > 0x7FFF || font->font_descent < -0x7FFF )
        {
          font->font_descent = font->font_descent < 0 ? -0x7FFF : 0x7FFF;
          FT_TRACE0(( "BDF_Face_Init: clamping font descent to value %d\n",
                      font->font_descent ));
        }

        bsize->height = (FT_Short)( font->font_ascent + font->font_descent );

        prop = bdf_get_font_property( font, "AVERAGE_WIDTH" );
        if ( prop )
        {
#ifdef FT_DEBUG_LEVEL_TRACE
          if ( prop->value.l < 0 )
            FT_TRACE0(( "BDF_Face_Init: negative average width\n" ));
#endif
          if ( prop->value.l >    0x7FFFL * 10 - 5   ||
               prop->value.l < -( 0x7FFFL * 10 - 5 ) )
          {
            bsize->width = 0x7FFF;
            FT_TRACE0(( "BDF_Face_Init: clamping average width to value %d\n",
                        bsize->width ));
          }
          else
            bsize->width = FT_ABS( (FT_Short)( ( prop->value.l + 5 ) / 10 ) );
        }
        else
        {
          /* this is a heuristical value */
          bsize->width = (FT_Short)FT_MulDiv( bsize->height, 2, 3 );
        }

        prop = bdf_get_font_property( font, "POINT_SIZE" );
        if ( prop )
        {
#ifdef FT_DEBUG_LEVEL_TRACE
          if ( prop->value.l < 0 )
            FT_TRACE0(( "BDF_Face_Init: negative point size\n" ));
#endif
          /* convert from 722.7 decipoints to 72 points per inch */
          if ( prop->value.l >  0x504C2L || /* 0x7FFF * 72270/7200 */
               prop->value.l < -0x504C2L )
          {
            bsize->size = 0x7FFF;
            FT_TRACE0(( "BDF_Face_Init: clamping point size to value %d\n",
                        bsize->size ));
          }
          else
            bsize->size = FT_MulDiv( FT_ABS( prop->value.l ),
                                     64 * 7200,
                                     72270L );
        }
        else if ( font->point_size )
        {
          if ( font->point_size > 0x7FFF )
          {
            bsize->size = 0x7FFF;
            FT_TRACE0(( "BDF_Face_Init: clamping point size to value %d\n",
                        bsize->size ));
          }
          else
            bsize->size = (FT_Pos)font->point_size << 6;
        }
        else
        {
          /* this is a heuristical value */
          bsize->size = bsize->width * 64;
        }

        prop = bdf_get_font_property( font, "PIXEL_SIZE" );
        if ( prop )
        {
#ifdef FT_DEBUG_LEVEL_TRACE
          if ( prop->value.l < 0 )
            FT_TRACE0(( "BDF_Face_Init: negative pixel size\n" ));
#endif
          if ( prop->value.l > 0x7FFF || prop->value.l < -0x7FFF )
          {
            bsize->y_ppem = 0x7FFF << 6;
            FT_TRACE0(( "BDF_Face_Init: clamping pixel size to value %d\n",
                        bsize->y_ppem ));
          }
          else
            bsize->y_ppem = FT_ABS( (FT_Short)prop->value.l ) << 6;
        }

        prop = bdf_get_font_property( font, "RESOLUTION_X" );
        if ( prop )
          value = prop->value.l;
        else
          value = (long)font->resolution_x;
        if ( value )
        {
#ifdef FT_DEBUG_LEVEL_TRACE
          if ( value < 0 )
            FT_TRACE0(( "BDF_Face_Init: negative X resolution\n" ));
#endif
          if ( value > 0x7FFF || value < -0x7FFF )
          {
            resolution_x = 0x7FFF;
            FT_TRACE0(( "BDF_Face_Init: clamping X resolution to value %d\n",
                        resolution_x ));
          }
          else
            resolution_x = FT_ABS( (FT_Short)value );
        }

        prop = bdf_get_font_property( font, "RESOLUTION_Y" );
        if ( prop )
          value = prop->value.l;
        else
          value = (long)font->resolution_y;
        if ( value )
        {
#ifdef FT_DEBUG_LEVEL_TRACE
          if ( value < 0 )
            FT_TRACE0(( "BDF_Face_Init: negative Y resolution\n" ));
#endif
          if ( value > 0x7FFF || value < -0x7FFF )
          {
            resolution_y = 0x7FFF;
            FT_TRACE0(( "BDF_Face_Init: clamping Y resolution to value %d\n",
                        resolution_y ));
          }
          else
            resolution_y = FT_ABS( (FT_Short)value );
        }

        if ( bsize->y_ppem == 0 )
        {
          bsize->y_ppem = bsize->size;
          if ( resolution_y )
            bsize->y_ppem = FT_MulDiv( bsize->y_ppem, resolution_y, 72 );
        }
        if ( resolution_x && resolution_y )
          bsize->x_ppem = FT_MulDiv( bsize->y_ppem,
                                     resolution_x,
                                     resolution_y );
        else
          bsize->x_ppem = bsize->y_ppem;
      }

      /* encoding table */
      {
        bdf_glyph_t*   cur = font->glyphs;
        unsigned long  n;


        if ( FT_NEW_ARRAY( face->en_table, font->glyphs_size ) )
          goto Exit;

        face->default_glyph = 0;
        for ( n = 0; n < font->glyphs_size; n++ )
        {
          (face->en_table[n]).enc = cur[n].encoding;
          FT_TRACE4(( "  idx %d, val 0x%lX\n", n, cur[n].encoding ));
          (face->en_table[n]).glyph = (FT_UShort)n;

          if ( cur[n].encoding == font->default_char )
          {
            if ( n < FT_UINT_MAX )
              face->default_glyph = (FT_UInt)n;
            else
              FT_TRACE1(( "BDF_Face_Init:"
                          " idx %d is too large for this system\n", n ));
          }
        }
      }

      /* charmaps */
      {
        bdf_property_t  *charset_registry, *charset_encoding;
        FT_Bool          unicode_charmap  = 0;


        charset_registry =
          bdf_get_font_property( font, "CHARSET_REGISTRY" );
        charset_encoding =
          bdf_get_font_property( font, "CHARSET_ENCODING" );
        if ( charset_registry && charset_encoding )
        {
          if ( charset_registry->format == BDF_ATOM &&
               charset_encoding->format == BDF_ATOM &&
               charset_registry->value.atom         &&
               charset_encoding->value.atom         )
          {
            const char*  s;


            if ( FT_STRDUP( face->charset_encoding,
                            charset_encoding->value.atom ) ||
                 FT_STRDUP( face->charset_registry,
                            charset_registry->value.atom ) )
              goto Exit;

            /* Uh, oh, compare first letters manually to avoid dependency */
            /* on locales.                                                */
            s = face->charset_registry;
            if ( ( s[0] == 'i' || s[0] == 'I' ) &&
                 ( s[1] == 's' || s[1] == 'S' ) &&
                 ( s[2] == 'o' || s[2] == 'O' ) )
            {
              s += 3;
              if ( !ft_strcmp( s, "10646" )                      ||
                   ( !ft_strcmp( s, "8859" ) &&
                     !ft_strcmp( face->charset_encoding, "1" ) ) )
                unicode_charmap = 1;
              /* another name for ASCII */
              else if ( !ft_strcmp( s, "646.1991" )                 &&
                        !ft_strcmp( face->charset_encoding, "IRV" ) )
                unicode_charmap = 1;
            }

            {
              FT_CharMapRec  charmap;


              charmap.face        = FT_FACE( face );
              charmap.encoding    = FT_ENCODING_NONE;
              /* initial platform/encoding should indicate unset status? */
              charmap.platform_id = TT_PLATFORM_APPLE_UNICODE;
              charmap.encoding_id = TT_APPLE_ID_DEFAULT;

              if ( unicode_charmap )
              {
                charmap.encoding    = FT_ENCODING_UNICODE;
                charmap.platform_id = TT_PLATFORM_MICROSOFT;
                charmap.encoding_id = TT_MS_ID_UNICODE_CS;
              }

              error = FT_CMap_New( &bdf_cmap_class, NULL, &charmap, NULL );
            }

            goto Exit;
          }
        }

        /* otherwise assume Adobe standard encoding */

        {
          FT_CharMapRec  charmap;


          charmap.face        = FT_FACE( face );
          charmap.encoding    = FT_ENCODING_ADOBE_STANDARD;
          charmap.platform_id = TT_PLATFORM_ADOBE;
          charmap.encoding_id = TT_ADOBE_ID_STANDARD;

          error = FT_CMap_New( &bdf_cmap_class, NULL, &charmap, NULL );

          /* Select default charmap */
          if ( bdfface->num_charmaps )
            bdfface->charmap = bdfface->charmaps[0];
        }
      }
    }

  Exit:
    return error;

  Fail:
    BDF_Face_Done( bdfface );
    return FT_THROW( Unknown_File_Format );
  }